

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O0

string * __thiscall
google::protobuf::json_internal::MaybeOwnedString::ToString_abi_cxx11_(MaybeOwnedString *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  BufferingGuard local_68 [3];
  allocator<char> local_49;
  string_view local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  add_pointer_t<google::protobuf::json_internal::MaybeOwnedString::StreamOwned> local_18;
  type *unowned;
  MaybeOwnedString *this_local;
  
  unowned = (type *)this;
  local_18 = std::
             get_if<google::protobuf::json_internal::MaybeOwnedString::StreamOwned,std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                       (&this->data_);
  if (local_18 != (add_pointer_t<google::protobuf::json_internal::MaybeOwnedString::StreamOwned>)0x0
     ) {
    local_48 = StreamOwned::AsView(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_38,&local_48,&local_49);
    std::
    variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>::
    operator=((variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_49);
    BufferingGuard::BufferingGuard(local_68,(ZeroCopyBufferedStream *)0x0);
    BufferingGuard::operator=(&this->token_,local_68);
    BufferingGuard::~BufferingGuard(local_68);
  }
  pbVar1 = std::
           get<std::__cxx11::string,std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                     (&this->data_);
  return pbVar1;
}

Assistant:

std::string& ToString() {
    if (auto* unowned = absl::get_if<StreamOwned>(&data_)) {
      data_ = std::string(unowned->AsView());
      token_ = BufferingGuard{};
    }

    return absl::get<std::string>(data_);
  }